

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
callable_impl<void,_cppcms::impl::cgi::scgi::ignore_io>::callable_impl
          (callable_impl<void,_cppcms::impl::cgi::scgi::ignore_io> *this,ignore_io *f)

{
  callable<void_(const_std::error_code_&,_unsigned_long)> *in_RDI;
  ignore_io *in_stack_ffffffffffffffc8;
  
  callable<void_(const_std::error_code_&,_unsigned_long)>::callable(in_RDI);
  (in_RDI->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__callable_impl_00530b68;
  cppcms::impl::cgi::scgi::ignore_io::ignore_io((ignore_io *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

callable_impl(F f) : func(f){}